

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

char * ODDLParser::OpenDDLParser::parseDataList
                 (char *in,char *end,ValueType type,Value **data,size_t *numValues,Reference **refs,
                 size_t *numRefs)

{
  bool bVar1;
  Reference *this;
  size_type sVar2;
  reference names_00;
  Reference *ref;
  undefined1 local_68 [8];
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> names;
  Value *prev;
  Value *current;
  Reference **refs_local;
  size_t *numValues_local;
  Value **data_local;
  char *pcStack_20;
  ValueType type_local;
  char *end_local;
  char *in_local;
  
  *data = (Value *)0x0;
  *numRefs = 0;
  *numValues = 0;
  in_local = in;
  if ((in != (char *)0x0) && (in != end)) {
    current = (Value *)refs;
    refs_local = (Reference **)numValues;
    numValues_local = (size_t *)data;
    data_local._4_4_ = type;
    pcStack_20 = end;
    end_local = in;
    end_local = lookForNextToken<char>(in,end);
    if (*end_local == '{') {
      end_local = end_local + 1;
      names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      do {
        if (*end_local == '}') break;
        prev = (Value *)0x0;
        end_local = lookForNextToken<char>(end_local,pcStack_20);
        if (data_local._4_4_ == ddl_ref) {
          std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::vector
                    ((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)local_68);
          end_local = parseReference(end_local,pcStack_20,
                                     (vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                      *)local_68);
          bVar1 = std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::empty
                            ((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)
                             local_68);
          if (!bVar1) {
            this = (Reference *)operator_new(0x10);
            sVar2 = std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::size
                              ((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)
                               local_68);
            names_00 = std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::
                       operator[]((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *
                                  )local_68,0);
            Reference::Reference(this,sVar2,names_00);
            *(Reference **)current = this;
            sVar2 = std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::size
                              ((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)
                               local_68);
            *numRefs = sVar2;
          }
          std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::~vector
                    ((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)local_68);
        }
        else if (data_local._4_4_ == ddl_none) {
          bVar1 = isInteger<char>(end_local,pcStack_20);
          if (bVar1) {
            end_local = parseIntegerLiteral(end_local,pcStack_20,&prev,ddl_int32);
          }
          else {
            bVar1 = isFloat<char>(end_local,pcStack_20);
            if (bVar1) {
              end_local = parseFloatingLiteral(end_local,pcStack_20,&prev,ddl_float);
            }
            else {
              bVar1 = isStringLiteral<char>(*end_local);
              if (bVar1) {
                end_local = parseStringLiteral(end_local,pcStack_20,&prev);
              }
              else {
                bVar1 = isHexLiteral<char>(end_local,pcStack_20);
                if (bVar1) {
                  end_local = parseHexaLiteral(end_local,pcStack_20,&prev);
                }
              }
            }
          }
        }
        else if ((uint)(data_local._4_4_ + ddl_none) < 8) {
          end_local = parseIntegerLiteral(end_local,pcStack_20,&prev,data_local._4_4_);
        }
        else if ((uint)(data_local._4_4_ + ~ddl_unsigned_int64) < 3) {
          end_local = parseFloatingLiteral(end_local,pcStack_20,&prev,data_local._4_4_);
        }
        else if (data_local._4_4_ == ddl_string) {
          end_local = parseStringLiteral(end_local,pcStack_20,&prev);
        }
        if (prev != (Value *)0x0) {
          if (*numValues_local == 0) {
            *numValues_local = (size_t)prev;
          }
          else {
            Value::setNext((Value *)names.
                                    super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,prev);
          }
          *refs_local = (Reference *)((long)&(*refs_local)->m_numRefs + 1);
          names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)prev;
        }
        end_local = getNextSeparator<char>(end_local,pcStack_20);
      } while (((*end_local == ',') || (*Grammar::CloseBracketToken == *end_local)) ||
              (bVar1 = isSpace<char>(*end_local), bVar1));
      end_local = end_local + 1;
    }
    in_local = end_local;
  }
  return in_local;
}

Assistant:

char *OpenDDLParser::parseDataList( char *in, char *end, Value::ValueType type, Value **data, 
                                    size_t &numValues, Reference **refs, size_t &numRefs ) {
    *data = ddl_nullptr;
    numValues = numRefs = 0;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    if( *in == '{' ) {
        ++in;
        Value *current( ddl_nullptr ), *prev( ddl_nullptr );
        while( '}' != *in ) {
            current = ddl_nullptr;
            in = lookForNextToken( in, end );
            if ( Value::ddl_ref == type ) {
                std::vector<Name*> names;
                in = parseReference( in, end, names );
                if ( !names.empty() ) {
                    Reference *ref = new Reference( names.size(), &names[ 0 ] );
                    *refs = ref;
                    numRefs = names.size();
                }
            } else  if ( Value::ddl_none == type ) {
                if (isInteger( in, end )) {
                    in = parseIntegerLiteral( in, end, &current );
                } else if (isFloat( in, end )) {
                    in = parseFloatingLiteral( in, end, &current );
                } else if (isStringLiteral( *in )) {
                    in = parseStringLiteral( in, end, &current );
                } else if (isHexLiteral( in, end )) {
                    in = parseHexaLiteral( in, end, &current );
                }
            } else {
                switch(type){
                    case Value::ddl_int8:
                    case Value::ddl_int16:
                    case Value::ddl_int32:
                    case Value::ddl_int64:
                    case Value::ddl_unsigned_int8:
                    case Value::ddl_unsigned_int16:
                    case Value::ddl_unsigned_int32:
                    case Value::ddl_unsigned_int64:
                        in = parseIntegerLiteral( in, end, &current, type);
                        break;
                    case Value::ddl_half:
                    case Value::ddl_float:
                    case Value::ddl_double:
                        in = parseFloatingLiteral( in, end, &current, type);
                        break;
                    case Value::ddl_string:
                        in = parseStringLiteral( in, end, &current );
                        break;
                    default:
                        break;
                }
            }

            if( ddl_nullptr != current ) {
                if( ddl_nullptr == *data ) {
                    *data = current;
                    prev = current;
                } else {
                    prev->setNext( current );
                    prev = current;
                }
                ++numValues;
            }

            in = getNextSeparator( in, end );
            if( ',' != *in && Grammar::CloseBracketToken[ 0 ] != *in && !isSpace( *in ) ) {
                break;
            }
        }
        ++in;
    }

    return in;
}